

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O0

void __thiscall mbc::Val::Person::update_ID_(Person *this)

{
  Str *this_00;
  string local_30;
  Person *local_10;
  Person *this_local;
  
  this_00 = this->ID_;
  local_10 = this;
  hash__abi_cxx11_(&local_30,this);
  _ValAtom::set(&this_00->super__ValAtom,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Person::update_ID_() {
    ID_ -> set(hash_());
}